

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidget::initStyleOption(QDockWidget *this,QStyleOptionDockWidget *option)

{
  long lVar1;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  QDockWidgetPrivate *d;
  QLayout *pQVar5;
  QDockWidgetLayout *pQVar6;
  QDockWidgetGroupWindow *pQVar7;
  QWidget *widget;
  
  if (option != (QStyleOptionDockWidget *)0x0) {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    pQVar5 = QWidget::layout(&this->super_QWidget);
    pQVar6 = QtPrivate::qobject_cast_helper<QDockWidgetLayout*,QObject>(&pQVar5->super_QObject);
    pQVar7 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                       (*(QObject **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
    widget = &this->super_QWidget;
    if ((pQVar7 != (QDockWidgetGroupWindow *)0x0) &&
       (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
      widget = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    }
    QStyleOption::initFrom(&option->super_QStyleOption,widget);
    RVar2.m_i = (pQVar6->_titleArea).y1.m_i;
    RVar3.m_i = (pQVar6->_titleArea).x2.m_i;
    RVar4.m_i = (pQVar6->_titleArea).y2.m_i;
    (option->super_QStyleOption).rect.x1 = (Representation)(pQVar6->_titleArea).x1.m_i;
    (option->super_QStyleOption).rect.y1 = (Representation)RVar2.m_i;
    (option->super_QStyleOption).rect.x2 = (Representation)RVar3.m_i;
    (option->super_QStyleOption).rect.y2 = (Representation)RVar4.m_i;
    QString::operator=(&option->title,(QString *)(lVar1 + 0x290));
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    option->closable = (bool)(*(byte *)(lVar1 + 0x260) & 1);
    option->movable = (bool)(*(byte *)(lVar1 + 0x260) >> 1 & 1);
    option->floatable = (bool)(*(byte *)(lVar1 + 0x260) >> 2 & 1);
    pQVar5 = QWidget::layout(&this->super_QWidget);
    pQVar6 = QtPrivate::qobject_cast_helper<QDockWidgetLayout*,QObject>(&pQVar5->super_QObject);
    option->verticalTitleBar = (bool)(pQVar6->super_QLayout).super_QLayoutItem.field_0xc;
  }
  return;
}

Assistant:

void QDockWidget::initStyleOption(QStyleOptionDockWidget *option) const
{
    Q_D(const QDockWidget);

    if (!option)
        return;
    QDockWidgetLayout *dwlayout = qobject_cast<QDockWidgetLayout*>(layout());

    QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent());
    // If we are in a floating tab, init from the parent because the attributes and the geometry
    // of the title bar should be taken from the floating window.
    option->initFrom(floatingTab && !isFloating() ? parentWidget() : this);
    option->rect = dwlayout->titleArea();
    option->title = d->fixedWindowTitle;
    option->closable = hasFeature(this, QDockWidget::DockWidgetClosable);
    option->movable = hasFeature(this, QDockWidget::DockWidgetMovable);
    option->floatable = hasFeature(this, QDockWidget::DockWidgetFloatable);

    QDockWidgetLayout *l = qobject_cast<QDockWidgetLayout*>(layout());
    option->verticalTitleBar = l->verticalTitleBar;
}